

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.h
# Opt level: O0

int __thiscall CCharmapToUniSB::mapchar(CCharmapToUniSB *this,wchar_t *ch,char **p,size_t *len)

{
  size_t sVar1;
  byte *pbVar2;
  size_t *len_local;
  char **p_local;
  wchar_t *ch_local;
  CCharmapToUniSB *this_local;
  uint local_4;
  
  sVar1 = *len;
  if (sVar1 != 0) {
    pbVar2 = (byte *)*p;
    *p = (char *)(pbVar2 + 1);
    *ch = *(wchar_t *)(&(this->super_CCharmapToUniSB_basic).field_0x20c + (ulong)*pbVar2 * 4);
    *len = *len - 1;
  }
  local_4 = (uint)(sVar1 != 0);
  return local_4;
}

Assistant:

virtual int mapchar(wchar_t &ch, const char *&p, size_t &len)
    {
        if (len >= 1)
        {
            /* map the character */
            ch = map_[(unsigned char)*p++];

            /* deduct it from the length */
            len -= 1;

            /* success */
            return TRUE;
        }
        else
            return FALSE;
    }